

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t encoder_base64_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  
  if ((part->encstate).bufend <= (part->encstate).bufbeg) {
    sVar5 = 0;
LAB_0013eca1:
    if (ateof && 3 < size) {
      buffer[2] = '=';
      buffer[3] = '=';
      sVar9 = (part->encstate).bufbeg;
      lVar6 = (part->encstate).bufend - sVar9;
      if (lVar6 == 1) {
        uVar7 = 0;
      }
      else {
        if (lVar6 != 2) {
          return sVar5;
        }
        uVar7 = (ulong)(byte)(part->encstate).buf[sVar9 + 1] << 8;
      }
      uVar8 = (ulong)(byte)(part->encstate).buf[sVar9] << 0x10;
      *buffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8 >> 0x12];
      buffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)((int)uVar8 + (int)uVar7) >> 0xc & 0x3f];
      sVar9 = (part->encstate).bufbeg + 1;
      (part->encstate).bufbeg = sVar9;
      if (sVar9 != (part->encstate).bufend) {
        buffer[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(uint)(uVar7 >> 6) & 0x3c];
        psVar1 = &(part->encstate).bufbeg;
        *psVar1 = *psVar1 + 1;
      }
      sVar5 = sVar5 + 4;
      (part->encstate).pos = (part->encstate).pos + 4;
    }
    return sVar5;
  }
  sVar5 = 0;
  do {
    if (0x48 < (part->encstate).pos) {
      if (size < 2) goto LAB_0013eca1;
      buffer[0] = '\r';
      buffer[1] = '\n';
      buffer = buffer + 2;
      (part->encstate).pos = 0;
      sVar5 = sVar5 + 2;
      size = size - 2;
    }
    if ((size < 4) || (sVar9 = (part->encstate).bufbeg, (part->encstate).bufend - sVar9 < 3))
    goto LAB_0013eca1;
    (part->encstate).bufbeg = sVar9 + 1;
    bVar2 = (part->encstate).buf[sVar9];
    (part->encstate).bufbeg = sVar9 + 2;
    uVar4 = (uint)(byte)(part->encstate).buf[sVar9 + 1] * 0x100;
    (part->encstate).bufbeg = sVar9 + 3;
    bVar3 = (part->encstate).buf[sVar9 + 2];
    *buffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 >> 2];
    buffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uVar4 | (uint)bVar2 << 0x10) >> 0xc & 0x3f];
    buffer[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [uVar4 + bVar3 >> 6 & 0x3f];
    buffer[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
    buffer = buffer + 4;
    sVar5 = sVar5 + 4;
    (part->encstate).pos = (part->encstate).pos + 4;
    size = size - 4;
    if ((part->encstate).bufend <= (part->encstate).bufbeg) goto LAB_0013eca1;
  } while( true );
}

Assistant:

static size_t encoder_base64_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t cursize = 0;
  int i;
  char *ptr = buffer;

  while(st->bufbeg < st->bufend) {
    /* Line full ? */
    if(st->pos > MAX_ENCODED_LINE_LENGTH - 4) {
      /* Yes, we need 2 characters for CRLF. */
      if(size < 2)
        break;
      *ptr++ = '\r';
      *ptr++ = '\n';
      st->pos = 0;
      cursize += 2;
      size -= 2;
    }

    /* Be sure there is enough space and input data for a base64 group. */
    if(size < 4 || st->bufend - st->bufbeg < 3)
      break;

    /* Encode three bytes as four characters. */
    i = st->buf[st->bufbeg++] & 0xFF;
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    *ptr++ = base64[(i >> 18) & 0x3F];
    *ptr++ = base64[(i >> 12) & 0x3F];
    *ptr++ = base64[(i >> 6) & 0x3F];
    *ptr++ = base64[i & 0x3F];
    cursize += 4;
    st->pos += 4;
    size -= 4;
  }

  /* If at eof, we have to flush the buffered data. */
  if(ateof && size >= 4) {
    /* Buffered data size can only be 0, 1 or 2. */
    ptr[2] = ptr[3] = '=';
    i = 0;
    switch(st->bufend - st->bufbeg) {
    case 2:
      i = (st->buf[st->bufbeg + 1] & 0xFF) << 8;
      /* FALLTHROUGH */
    case 1:
      i |= (st->buf[st->bufbeg] & 0xFF) << 16;
      ptr[0] = base64[(i >> 18) & 0x3F];
      ptr[1] = base64[(i >> 12) & 0x3F];
      if(++st->bufbeg != st->bufend) {
        ptr[2] = base64[(i >> 6) & 0x3F];
        st->bufbeg++;
      }
      cursize += 4;
      st->pos += 4;
      break;
    }
  }

#ifdef CURL_DOES_CONVERSIONS
  /* This is now textual data, Convert character codes. */
  if(part->easy && cursize) {
    CURLcode result = Curl_convert_to_network(part->easy, buffer, cursize);
    if(result)
      return READ_ERROR;
  }
#endif

  return cursize;
}